

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

void DataRefs::LTSetDebugAcFilter(void *param_1,int i)

{
  logLevelTy lVar1;
  undefined8 uVar2;
  uint in_ESI;
  DataRefs *in_RDI;
  void *unaff_retaddr;
  bool bWasFilterDefined;
  string *psVar3;
  string local_30 [35];
  undefined1 local_d;
  
  local_d = dataRefs.uDebugAcFilter != 0;
  if ((-1 < (int)in_ESI) && (in_ESI < 0x1000000)) {
    dataRefs.uDebugAcFilter = in_ESI;
    if ((int)in_ESI < 1) {
      if (((bool)local_d) && (lVar1 = GetLogLevel(&dataRefs), (int)lVar1 < 3)) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x77a,"LTSetDebugAcFilter",logWARN,"DEBUG Filtering for a/c REMOVED");
      }
    }
    else {
      LTSetAcKey(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
      lVar1 = GetLogLevel(&dataRefs);
      if ((int)lVar1 < 3) {
        psVar3 = local_30;
        GetDebugAcFilter_abi_cxx11_(in_RDI);
        uVar2 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x778,"LTSetDebugAcFilter",logWARN,"DEBUG Filtering for a/c \'%s\'",uVar2,psVar3);
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  return;
}

Assistant:

void DataRefs::LTSetDebugAcFilter( void* /*inRefcon*/, int i )
{
    bool bWasFilterDefined = dataRefs.uDebugAcFilter != 0;
    
    // match hex range of transpIcao codes
    if ( 0x000000 <= i && (unsigned)i <= MAX_TRANSP_ICAO ) {
        dataRefs.uDebugAcFilter = unsigned(i);
        
        // also set the key for the a/c info datarefs
        if (i > 0x000000) {
            LTSetAcKey(reinterpret_cast<void*>(long(DR_AC_KEY)), i);
            LOG_MSG(logWARN,DBG_FILTER_AC,
                    dataRefs.GetDebugAcFilter().c_str());
        } else if (bWasFilterDefined) {
            LOG_MSG(logWARN,DBG_FILTER_AC_REMOVED);
        }
    }
}